

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::InferDependencies(cmComputeLinkDepends *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppDVar2;
  DependSetList *pDVar3;
  pointer pcVar4;
  uint uVar5;
  ulong uVar6;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *__x;
  DependSet intersection;
  DependSet common;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  uVar5 = 0;
  while( true ) {
    uVar6 = (ulong)uVar5;
    ppDVar2 = (this->InferredDependSets).
              super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->InferredDependSets).
                      super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2 >> 3) <= uVar6)
    break;
    pDVar3 = ppDVar2[uVar6];
    if ((pDVar3 != (DependSetList *)0x0) &&
       (__x = *(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> **)
               &(pDVar3->
                super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                ).
                super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                ._M_impl,
       __x != *(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> **)
               ((long)&(pDVar3->
                       super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                       ).
                       super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                       ._M_impl + 8))) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                (&local_60,__x);
      while (__x + 1 !=
             *(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> **)
              ((long)&(pDVar3->
                      super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                      ).
                      super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                      ._M_impl + 8)) {
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        std::
        __set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<cmComputeLinkDepends::DependSet>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                   &local_60._M_impl.super__Rb_tree_header,
                   __x[1]._M_impl.super__Rb_tree_header._M_header._M_left,
                   &__x[1]._M_impl.super__Rb_tree_header,&local_90,p_Var1);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&local_60,&local_90);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_90);
        __x = __x + 1;
      }
      pcVar4 = (this->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
      insert<std::_Rb_tree_const_iterator<int>,void>
                ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar4 + uVar6),
                 *(pointer *)
                  ((long)&pcVar4[uVar6].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                          super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8),
                 (_Rb_tree_const_iterator<int>)
                 local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<int>)&local_60._M_impl.super__Rb_tree_header);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::InferDependencies()
{
  // The inferred dependency sets for each item list the possible
  // dependencies.  The intersection of the sets for one item form its
  // inferred dependencies.
  for (unsigned int depender_index = 0;
       depender_index < this->InferredDependSets.size(); ++depender_index) {
    // Skip items for which dependencies do not need to be inferred or
    // for which the inferred dependency sets are empty.
    DependSetList* sets = this->InferredDependSets[depender_index];
    if (!sets || sets->empty()) {
      continue;
    }

    // Intersect the sets for this item.
    DependSetList::const_iterator i = sets->begin();
    DependSet common = *i;
    for (++i; i != sets->end(); ++i) {
      DependSet intersection;
      std::set_intersection(common.begin(), common.end(), i->begin(), i->end(),
                            std::inserter(intersection, intersection.begin()));
      common = intersection;
    }

    // Add the inferred dependencies to the graph.
    cmGraphEdgeList& edges = this->EntryConstraintGraph[depender_index];
    edges.insert(edges.end(), common.begin(), common.end());
  }
}